

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttkern.c
# Opt level: O1

FT_Int tt_face_get_kerning(TT_Face face,FT_UInt left_glyph,FT_UInt right_glyph)

{
  uint uVar1;
  FT_Byte *pFVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  FT_Int FVar8;
  FT_Byte *pFVar9;
  FT_UInt FVar10;
  FT_ULong key0;
  ulong uVar11;
  FT_Byte *pFVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  FT_Byte *base;
  FT_Byte *pFVar17;
  bool bVar18;
  
  FVar10 = face->num_kern_tables;
  FVar8 = 0;
  if (9 < (long)face->kern_table_size && FVar10 != 0) {
    pFVar17 = face->kern_table;
    pFVar9 = pFVar17 + face->kern_table_size;
    pFVar2 = pFVar17 + 10;
    uVar11 = (ulong)right_glyph | (ulong)left_glyph << 0x10;
    uVar5 = 1;
    FVar8 = 0;
    pFVar17 = pFVar17 + 4;
    do {
      pFVar12 = pFVar17 + (ushort)(*(ushort *)(pFVar17 + 2) << 8 | *(ushort *)(pFVar17 + 2) >> 8);
      if (pFVar9 < pFVar17 + (ushort)(*(ushort *)(pFVar17 + 2) << 8 | *(ushort *)(pFVar17 + 2) >> 8)
         ) {
        pFVar12 = pFVar9;
      }
      if (((face->kern_avail_bits & uVar5) != 0) && (pFVar17[4] == '\0')) {
        puVar13 = (uint *)(pFVar17 + 0xe);
        lVar7 = (long)pFVar12 - (long)puVar13;
        uVar4 = ((int)(lVar7 / 6) + (int)(lVar7 >> 0x3f)) -
                (SUB164(SEXT816(lVar7) * SEXT816(0x2aaaaaaaaaaaaaab),0xc) >> 0x1f);
        if ((long)(ulong)((uint)CONCAT11(*pFVar2,pFVar17[7]) * 6) <= lVar7) {
          uVar4 = (uint)CONCAT11(*pFVar2,pFVar17[7]);
        }
        if ((face->kern_order_bits & uVar5) == 0) {
          if (uVar4 == 0) {
            bVar18 = true;
            uVar1 = 0;
          }
          else {
            uVar1 = 0;
            do {
              uVar15 = *puVar13;
              if ((uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                  uVar15 << 0x18) == uVar11) {
                uVar1 = (int)(short)((ushort)(byte)puVar13[1] << 8) |
                        (uint)*(byte *)((long)puVar13 + 5);
                iVar16 = 0xb;
                goto LAB_001611f9;
              }
              puVar13 = (uint *)((long)puVar13 + 6);
              uVar4 = uVar4 - 1;
            } while (uVar4 != 0);
            iVar16 = 0;
LAB_001611f9:
            bVar18 = iVar16 == 0;
          }
          if (!bVar18) goto LAB_00161208;
LAB_00161214:
          bVar18 = true;
        }
        else {
          uVar1 = 0;
          uVar15 = 0;
          do {
            if (uVar4 <= uVar15) {
              iVar16 = 0;
              break;
            }
            uVar3 = (ulong)((uVar4 + uVar15 & 0xfffffffe) * 3);
            uVar14 = *(uint *)((long)puVar13 + uVar3);
            uVar6 = (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                           uVar14 << 0x18);
            if (uVar6 == uVar11) {
              uVar1 = (int)(short)((ushort)pFVar17[uVar3 + 0x12] << 8) | (uint)pFVar17[uVar3 + 0x13]
              ;
              iVar16 = 0xb;
            }
            else {
              uVar14 = uVar4 + uVar15 >> 1;
              if (uVar6 < uVar11) {
                uVar15 = uVar14 + 1;
                uVar14 = uVar4;
              }
              iVar16 = 0;
              uVar4 = uVar14;
            }
          } while (uVar6 != uVar11);
          if (iVar16 == 0) goto LAB_00161214;
LAB_00161208:
          bVar18 = false;
        }
        if (!bVar18) {
          if ((pFVar17[5] & 8) != 0) {
            FVar8 = 0;
          }
          FVar8 = FVar8 + uVar1;
        }
      }
      FVar10 = FVar10 - 1;
      if (FVar10 == 0) {
        return FVar8;
      }
      uVar5 = uVar5 * 2;
      pFVar2 = pFVar12 + 6;
      pFVar17 = pFVar12;
    } while (pFVar2 <= pFVar9);
  }
  return FVar8;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  tt_face_get_kerning( TT_Face  face,
                       FT_UInt  left_glyph,
                       FT_UInt  right_glyph )
  {
    FT_Int    result = 0;
    FT_UInt   count, mask;
    FT_Byte*  p       = face->kern_table;
    FT_Byte*  p_limit = p + face->kern_table_size;


    p   += 4;
    mask = 0x0001;

    for ( count = face->num_kern_tables;
          count > 0 && p + 6 <= p_limit;
          count--, mask <<= 1 )
    {
      FT_Byte* base     = p;
      FT_Byte* next;
      FT_UInt  version  = FT_NEXT_USHORT( p );
      FT_UInt  length   = FT_NEXT_USHORT( p );
      FT_UInt  coverage = FT_NEXT_USHORT( p );
      FT_UInt  num_pairs;
      FT_Int   value    = 0;

      FT_UNUSED( version );


      next = base + length;

      if ( next > p_limit )  /* handle broken table */
        next = p_limit;

      if ( ( face->kern_avail_bits & mask ) == 0 )
        goto NextTable;

      FT_ASSERT( p + 8 <= next ); /* tested in tt_face_load_kern */

      num_pairs = FT_NEXT_USHORT( p );
      p        += 6;

      if ( ( next - p ) < 6 * (int)num_pairs )  /* handle broken count  */
        num_pairs = (FT_UInt)( ( next - p ) / 6 );

      switch ( coverage >> 8 )
      {
      case 0:
        {
          FT_ULong  key0 = TT_KERN_INDEX( left_glyph, right_glyph );


          if ( face->kern_order_bits & mask )   /* binary search */
          {
            FT_UInt   min = 0;
            FT_UInt   max = num_pairs;


            while ( min < max )
            {
              FT_UInt   mid = ( min + max ) >> 1;
              FT_Byte*  q   = p + 6 * mid;
              FT_ULong  key;


              key = FT_NEXT_ULONG( q );

              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( q );
                goto Found;
              }
              if ( key < key0 )
                min = mid + 1;
              else
                max = mid;
            }
          }
          else /* linear search */
          {
            FT_UInt  count2;


            for ( count2 = num_pairs; count2 > 0; count2-- )
            {
              FT_ULong  key = FT_NEXT_ULONG( p );


              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( p );
                goto Found;
              }
              p += 2;
            }
          }
        }
        break;

       /*
        *  We don't support format 2 because we haven't seen a single font
        *  using it in real life...
        */

      default:
        ;
      }

      goto NextTable;

    Found:
      if ( coverage & 8 ) /* override or add */
        result = value;
      else
        result += value;

    NextTable:
      p = next;
    }

    return result;
  }